

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O3

iterator_base<true>
pstore::chunked_sequence<int,2ul,4ul,4ul>::
end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>const,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>>
          (chunked_sequence<int,_2UL,_4UL,_4UL> *cv)

{
  size_t sVar1;
  const_iterator cVar2;
  iterator_base<true> iVar3;
  
  if ((cv->chunks_).
      super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
      ._M_impl._M_node._M_size != 0) {
    if (cv->size_ == 0) {
      cVar2 = chunked_sequence<int,_2UL,_4UL,_4UL>::begin(cv);
      sVar1 = cVar2.index_;
      cv = (chunked_sequence<int,_2UL,_4UL,_4UL> *)cVar2.chunk_it_._M_node;
    }
    else {
      sVar1 = 0;
    }
    iVar3.index_ = sVar1;
    iVar3.chunk_it_._M_node = (_List_node_base *)cv;
    return iVar3;
  }
  assert_failed("cv.chunks_.size () > 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x13f);
}

Assistant:

Result chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::end_impl (
        ChunkedSequence & cv) noexcept {
        // We always have at least 1 chunk. If the container is empty then return the begin iterator
        // otherwise an iterator referencing end and of the last member of the last chunk.
        PSTORE_ASSERT (cv.chunks_.size () > 0U);
        if (cv.size () > 0U) {
            return {cv.chunks_.end (), 0U};
        }
        return cv.begin ();
    }